

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O2

void lore_append_movement(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  short sVar1;
  wchar_t wVar2;
  bitflag *flags_00;
  byte *pbVar3;
  _Bool _Var4;
  byte bVar5;
  wchar_t wVar6;
  char *pcVar7;
  ushort uVar8;
  byte *pbVar9;
  uint8_t uVar10;
  ulong uVar11;
  int flag;
  char local_58 [8];
  bitflag *local_50;
  bitflag *local_48;
  bitflag flags [12];
  
  local_50 = known_flags;
  if (((tb == (textblock *)0x0) || (race == (monster_race *)0x0)) || (lore == (monster_lore *)0x0))
  {
    __assert_fail("tb && race && lore",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                  ,0x3cc,
                  "void lore_append_movement(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
                 );
  }
  textblock_append(tb,"This");
  create_mon_flag_mask(flags,10,0xf);
  local_48 = race->flags;
  flag_inter(flags,local_48,0xc);
  flag = 1;
  while( true ) {
    wVar6 = flag_next(flags,0xc,flag);
    if (wVar6 == L'\0') break;
    pcVar7 = describe_race_flag(wVar6);
    textblock_append_c(tb,'\x0e'," %s",pcVar7);
    flag = wVar6 + L'\x01';
  }
  create_mon_flag_mask(flags,9,0xf);
  flag_inter(flags,local_48,0xc);
  wVar6 = flag_next(flags,0xc,1);
  if (wVar6 == L'\0') {
    textblock_append_c(tb,'\x0e'," creature");
  }
  else {
    pcVar7 = describe_race_flag(wVar6);
    textblock_append_c(tb,'\x0e'," %s",pcVar7);
  }
  flags_00 = local_50;
  wVar6 = race->level;
  if (wVar6 == L'\0') {
    textblock_append(tb," lives in the town");
  }
  else {
    sVar1 = player->max_depth;
    _Var4 = flag_has_dbg(local_50,0xc,0xc,"known_flags","RF_FORCE_DEPTH");
    pcVar7 = " is normally found ";
    if (_Var4) {
      pcVar7 = " is found ";
    }
    textblock_append(tb,pcVar7);
    textblock_append(tb,"at a danger level of ");
    uVar10 = '\x0e';
    if (sVar1 < wVar6) {
      uVar10 = '\x04';
    }
    textblock_append_c(tb,uVar10,"%d",(ulong)(uint)race->level);
  }
  textblock_append(tb,", and moves");
  _Var4 = flags_test(flags_00,0xc,0x1d,0x1c,0);
  if (!_Var4) goto LAB_0017213a;
  _Var4 = flag_has_dbg(flags_00,0xc,0x1d,"known_flags","RF_RAND_50");
  if (_Var4) {
    _Var4 = flag_has_dbg(flags_00,0xc,0x1c,"known_flags","RF_RAND_25");
    if (!_Var4) goto LAB_001720b6;
    pcVar7 = " extremely";
LAB_00172106:
    textblock_append(tb,pcVar7);
  }
  else {
LAB_001720b6:
    _Var4 = flag_has_dbg(flags_00,0xc,0x1d,"known_flags","RF_RAND_50");
    if (_Var4) {
      pcVar7 = " somewhat";
      goto LAB_00172106;
    }
    _Var4 = flag_has_dbg(flags_00,0xc,0x1c,"known_flags","RF_RAND_25");
    if (_Var4) {
      pcVar7 = " a bit";
      goto LAB_00172106;
    }
  }
  textblock_append(tb," erratically");
  if (race->speed != L'n') {
    textblock_append(tb,", and");
  }
LAB_0017213a:
  textblock_append(tb," ");
  if ((player->opts).opt[0x15] == true) {
    textblock_append(tb,"at ");
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    strnfmt(local_58,8,"%d.%dx",
            (ulong)("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                    [race->speed] / '\n'),
            (ulong)(ushort)((((uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                                    [race->speed] * 10) / 10) % 10));
    textblock_append_c(tb,'\x0e',"%s",local_58);
    textblock_append(tb," normal speed, which is ");
    bVar5 = "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
            [race->speed] /
            "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
            [(player->state).speed];
    uVar8 = (ushort)((((uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                             [race->speed] * 100) /
                     (uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                           [(player->state).speed]) % 100);
    if (uVar8 == 0) {
      strnfmt(local_58,8,"%dx",(ulong)bVar5);
    }
    else {
      if ((char)(uVar8 % 10) == '\0') {
        uVar11 = (ulong)(byte)(uVar8 / 10);
        pcVar7 = "%d.%dx";
      }
      else {
        uVar11 = (ulong)uVar8;
        pcVar7 = "%d.%02dx";
      }
      strnfmt(local_58,8,pcVar7,(ulong)bVar5,uVar11);
    }
    wVar6 = (player->state).speed;
    wVar2 = race->speed;
    if (wVar6 == wVar2) {
      pcVar7 = "the same as you";
    }
    else {
      uVar10 = (wVar6 < wVar2) + '\x03';
      if (wVar2 < wVar6) {
        uVar10 = '\r';
      }
      textblock_append_c(tb,uVar10,"%s",local_58);
      pcVar7 = " your speed";
    }
    textblock_append(tb,pcVar7);
  }
  else {
    wVar6 = race->speed;
    if (wVar6 == L'n') {
      textblock_append(tb,"at ");
      wVar6 = race->speed;
    }
    pcVar7 = "erroneously";
    pbVar3 = &lore_describe_speed_lore_speed_description;
    do {
      pbVar9 = pbVar3;
      if (*pbVar9 == 0xff) goto LAB_001722a9;
      pbVar3 = pbVar9 + 0x10;
    } while ((byte)wVar6 <= *pbVar9);
    pcVar7 = *(char **)(pbVar9 + 8);
LAB_001722a9:
    textblock_append_c(tb,'\x05',"%s",pcVar7);
  }
  _Var4 = flag_has_dbg(flags_00,0xc,0x1b,"known_flags","RF_NEVER_MOVE");
  if (_Var4) {
    textblock_append(tb,", but ");
    textblock_append_c(tb,'\r',"does not deign to chase intruders");
  }
  textblock_append(tb,".  ");
  return;
}

Assistant:

void lore_append_movement(textblock *tb, const struct monster_race *race,
						  const struct monster_lore *lore,
						  bitflag known_flags[RF_SIZE])
{
	int f;
	bitflag flags[RF_SIZE];

	assert(tb && race && lore);

	textblock_append(tb, "This");

	/* Get adjectives */
	create_mon_flag_mask(flags, RFT_RACE_A, RFT_MAX);
	rf_inter(flags, race->flags);
	for (f = rf_next(flags, FLAG_START); f; f = rf_next(flags, f + 1)) {
		textblock_append_c(tb, COLOUR_L_BLUE, " %s", describe_race_flag(f));
	}

	/* Get noun */
	create_mon_flag_mask(flags, RFT_RACE_N, RFT_MAX);
	rf_inter(flags, race->flags);
	f = rf_next(flags, FLAG_START);
	if (f) {
		textblock_append_c(tb, COLOUR_L_BLUE, " %s", describe_race_flag(f));
	} else {
		textblock_append_c(tb, COLOUR_L_BLUE, " creature");
	}

	/* Describe location */
	if (race->level == 0) {
		textblock_append(tb, " lives in the town");
	} else {
		uint8_t colour = (race->level > player->max_depth) ?
			COLOUR_RED : COLOUR_L_BLUE;

		if (rf_has(known_flags, RF_FORCE_DEPTH))
			textblock_append(tb, " is found ");
		else
			textblock_append(tb, " is normally found ");

		textblock_append(tb, "at a danger level of ");
		textblock_append_c(tb, colour, "%d", race->level);
	}

	textblock_append(tb, ", and moves");

	/* Random-ness */
	if (flags_test(known_flags, RF_SIZE, RF_RAND_50, RF_RAND_25, FLAG_END)) {
		/* Adverb */
		if (rf_has(known_flags, RF_RAND_50) && rf_has(known_flags, RF_RAND_25))
			textblock_append(tb, " extremely");
		else if (rf_has(known_flags, RF_RAND_50))
			textblock_append(tb, " somewhat");
		else if (rf_has(known_flags, RF_RAND_25))
			textblock_append(tb, " a bit");

		/* Adjective */
		textblock_append(tb, " erratically");

		/* Hack -- Occasional conjunction */
		if (race->speed != 110) textblock_append(tb, ", and");
	}

	/* Speed */
	textblock_append(tb, " ");

	if (OPT(player, effective_speed))
		lore_multiplier_speed(tb, race);
	else
		lore_adjective_speed(tb, race);

	/* The speed description also describes "attack speed" */
	if (rf_has(known_flags, RF_NEVER_MOVE)) {
		textblock_append(tb, ", but ");
		textblock_append_c(tb, COLOUR_L_GREEN,
						   "does not deign to chase intruders");
	}

	/* End this sentence */
	textblock_append(tb, ".  ");
}